

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Architecture.cpp
# Opt level: O0

void __thiscall
ArchitectureCommand::ArchitectureCommand(ArchitectureCommand *this,string *tempText,string *symText)

{
  Endianness EVar1;
  Architecture *pAVar2;
  string *symText_local;
  string *tempText_local;
  ArchitectureCommand *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__ArchitectureCommand_002a60a0;
  this->architecture = (Architecture *)0x0;
  std::__cxx11::string::string((string *)&this->tempText,(string *)tempText);
  std::__cxx11::string::string((string *)&this->symText,(string *)symText);
  pAVar2 = Architecture::current();
  this->architecture = pAVar2;
  pAVar2 = Architecture::current();
  EVar1 = (*pAVar2->_vptr_Architecture[7])();
  this->endianness = EVar1;
  return;
}

Assistant:

ArchitectureCommand::ArchitectureCommand(const std::string& tempText, const std::string& symText)
	: tempText(tempText), symText(symText)
{
	this->architecture = &Architecture::current();
	this->endianness = Architecture::current().getEndianness();
}